

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrapTCPService.h
# Opt level: O2

bool __thiscall
brynet::net::WrapTcpService::
addSession<std::function<void(brynet::net::AddSessionOption::Options&)>,std::function<void(brynet::net::AddSessionOption::Options&)>>
          (WrapTcpService *this,PTR *socket,
          function<void_(brynet::net::AddSessionOption::Options_&)> *args,
          function<void_(brynet::net::AddSessionOption::Options_&)> *args_1)

{
  undefined1 uVar1;
  long lVar2;
  initializer_list<std::function<void_(brynet::net::AddSessionOption::Options_&)>_> __l;
  allocator_type local_79;
  _Head_base<0UL,_brynet::net::TcpSocket_*,_false> local_78;
  vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
  local_70;
  function<void_(brynet::net::AddSessionOption::Options_&)> local_58;
  function<void_(brynet::net::AddSessionOption::Options_&)> local_38;
  
  local_78._M_head_impl =
       (socket->_M_t).
       super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>._M_t.
       super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>.
       super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl;
  (socket->_M_t).
  super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>._M_t.
  super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>.
  super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl = (TcpSocket *)0x0;
  std::function<void_(brynet::net::AddSessionOption::Options_&)>::function(&local_58,args);
  std::function<void_(brynet::net::AddSessionOption::Options_&)>::function(&local_38,args_1);
  __l._M_len = 2;
  __l._M_array = &local_58;
  std::
  vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
  ::vector(&local_70,__l,&local_79);
  uVar1 = brynet::net::WrapTcpService::_addSession(this,&local_78,&local_70);
  std::
  vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
  ::~vector(&local_70);
  lVar2 = 0x20;
  do {
    std::_Function_base::~_Function_base
              ((_Function_base *)((long)&local_58.super__Function_base._M_functor + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  if (local_78._M_head_impl != (TcpSocket *)0x0) {
    (**(code **)(*(long *)local_78._M_head_impl + 8))();
  }
  return (bool)uVar1;
}

Assistant:

bool                        addSession(TcpSocket::PTR socket, const Args& ... args)
            {
                return _addSession(std::move(socket), { args... });
            }